

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkForce.cpp
# Opt level: O2

void __thiscall chrono::ChLinkForce::ArchiveIN(ChLinkForce *this,ChArchiveIn *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_c0;
  ChNameValue<double> local_a8;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_90;
  ChNameValue<double> local_78;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_60;
  ChNameValue<double> local_48;
  ChNameValue<bool> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChLinkForce>(marchive);
  local_30._name = "m_active";
  local_30._flags = '\0';
  local_30._value = &this->m_active;
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->m_F;
  local_48._name = "m_F";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->m_F_modul;
  local_60._name = "m_F_modul";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  local_78._value = &this->m_K;
  local_78._name = "m_K";
  local_78._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_78);
  local_90._value = &this->m_K_modul;
  local_90._name = "m_K_modul";
  local_90._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_90);
  local_a8._value = &this->m_R;
  local_a8._name = "m_R";
  local_a8._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_a8);
  local_c0._value = &this->m_R_modul;
  local_c0._name = "m_R_modul";
  local_c0._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_c0);
  return;
}

Assistant:

void ChLinkForce::ArchiveIN(ChArchiveIn& marchive) {
    // class version number
    /*int version =*/ marchive.VersionRead<ChLinkForce>();

    // stream in all member data
    marchive >> CHNVP(m_active);
    marchive >> CHNVP(m_F);
    marchive >> CHNVP(m_F_modul);
    marchive >> CHNVP(m_K);
    marchive >> CHNVP(m_K_modul);
    marchive >> CHNVP(m_R);
    marchive >> CHNVP(m_R_modul);
}